

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O2

void Acb_DeriveCnfForNode(Acb_Ntk_t *p,int iObj,sat_solver *pSat,int OutVar)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *vClas;
  Vec_Int_t *vLits;
  int *piVar4;
  Vec_Int_t *vCnf;
  int i;
  long lVar5;
  
  p_00 = &p->vCover;
  vClas = Vec_IntAlloc(100);
  vLits = Vec_IntAlloc(100);
  (p->vCover).nSize = 0;
  piVar4 = Acb_ObjFanins(p,iObj);
  lVar5 = 0;
  while( true ) {
    if (*piVar4 <= lVar5) {
      Vec_IntPush(p_00,OutVar);
      vCnf = Vec_WecEntry(&p->vCnfs,iObj);
      Acb_TranslateCnf(vClas,vLits,(Vec_Str_t *)vCnf,p_00,-1);
      iVar2 = vClas->nSize;
      iVar1 = 0;
      for (i = 0; i < iVar2; i = i + 1) {
        iVar3 = Vec_IntEntry(vClas,i);
        iVar1 = sat_solver_addclause(pSat,vLits->pArray + iVar1,vLits->pArray + iVar3);
        if (iVar1 == 0) {
          puts("Error: SAT solver became UNSAT at a wrong place (while adding new CNF).");
        }
        iVar1 = iVar3;
      }
      Vec_IntFree(vClas);
      Vec_IntFree(vLits);
      return;
    }
    iVar2 = piVar4[lVar5 + 1];
    iVar1 = Acb_ObjFunc(p,iVar2);
    if (iVar1 < 0) break;
    iVar2 = Acb_ObjFunc(p,iVar2);
    Vec_IntPush(p_00,iVar2);
    lVar5 = lVar5 + 1;
  }
  __assert_fail("Acb_ObjFunc(p, iFanin) >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbMfs.c"
                ,0xad,"void Acb_DeriveCnfForNode(Acb_Ntk_t *, int, sat_solver *, int)");
}

Assistant:

void Acb_DeriveCnfForNode( Acb_Ntk_t * p, int iObj, sat_solver * pSat, int OutVar )
{
    Vec_Wec_t * vCnfs = &p->vCnfs;
    Vec_Int_t * vFaninVars = &p->vCover;
    Vec_Int_t * vClas = Vec_IntAlloc( 100 );
    Vec_Int_t * vLits = Vec_IntAlloc( 100 );
    int k, iFanin, * pFanins, Prev, This;
    // collect SAT variables
    Vec_IntClear( vFaninVars );
    Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
    {
        assert( Acb_ObjFunc(p, iFanin) >= 0 );
        Vec_IntPush( vFaninVars, Acb_ObjFunc(p, iFanin) );
    }
    Vec_IntPush( vFaninVars, OutVar );
    // derive CNF for the node
    Acb_TranslateCnf( vClas, vLits, (Vec_Str_t *)Vec_WecEntry(vCnfs, iObj), vFaninVars, -1 );
    // add clauses
    Prev = 0;
    Vec_IntForEachEntry( vClas, This, k )
    {
        if ( !sat_solver_addclause( pSat, Vec_IntArray(vLits) + Prev, Vec_IntArray(vLits) + This ) )
            printf( "Error: SAT solver became UNSAT at a wrong place (while adding new CNF).\n" );
        Prev = This;
    }
    Vec_IntFree( vClas );
    Vec_IntFree( vLits );
}